

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStreamPrivate::~QTextStreamPrivate(QTextStreamPrivate *this)

{
  if (this->deleteDevice == true) {
    QObject::blockSignals(&this->device->super_QObject,true);
    if (this->device != (QIODevice *)0x0) {
      (*(this->device->super_QObject)._vptr_QObject[4])();
    }
  }
  QLocale::~QLocale(&this->locale);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->readBuffer).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->writeBuffer).d);
  QStringConverterBase::State::clear(&(this->savedToUtf16).super_QStringConverter.state);
  QStringConverterBase::State::clear(&(this->toUtf16).super_QStringConverter.state);
  QStringConverterBase::State::clear(&(this->fromUtf16).super_QStringConverter.state);
  QObject::~QObject(&(this->deviceClosedNotifier).super_QObject);
  return;
}

Assistant:

QTextStreamPrivate::~QTextStreamPrivate()
{
    if (deleteDevice) {
#ifndef QT_NO_QOBJECT
        device->blockSignals(true);
#endif
        delete device;
    }
}